

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

bool cmState::IsCacheEntryType(string *key)

{
  bool bVar1;
  bool bVar2;
  string *local_10;
  
  local_10 = key;
  bVar1 = __gnu_cxx::__ops::_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>
          ::operator()((_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0> *)
                       &local_10,cmCacheEntryTypes_abi_cxx11_._M_elems);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0> *)
                       &local_10,cmCacheEntryTypes_abi_cxx11_._M_elems + 1);
    if (!bVar1) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>::operator()
                        ((_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0> *)
                         &local_10,cmCacheEntryTypes_abi_cxx11_._M_elems + 2);
      if (!bVar1) {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>::operator()
                          ((_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0>
                            *)&local_10,cmCacheEntryTypes_abi_cxx11_._M_elems + 3);
        if (!bVar1) {
          bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>::
                  operator()((_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0>
                              *)&local_10,cmCacheEntryTypes_abi_cxx11_._M_elems + 4);
          if (!bVar1) {
            bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>::
                    operator()((_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0>
                                *)&local_10,cmCacheEntryTypes_abi_cxx11_._M_elems + 5);
            if (!bVar1) {
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>::
                      operator()((_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0>
                                  *)&local_10,cmCacheEntryTypes_abi_cxx11_._M_elems + 6);
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  return std::any_of(
    cmCacheEntryTypes.begin(), cmCacheEntryTypes.end(),
    [&key](std::string const& i) -> bool { return key == i; });
}